

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotStemsEx<ImPlot::GetterXsYs<long_long>,ImPlot::GetterXsYRef<long_long>>
               (char *label_id,GetterXsYs<long_long> *get_mark,GetterXsYRef<long_long> *get_base)

{
  GetterXsYs<long_long> getter;
  GetterXsYs<long_long> getter_00;
  GetterXsYs<long_long> getter_01;
  GetterXsYs<long_long> getter_02;
  GetterXsYRef<long_long> *getter2;
  GetterXsYRef<long_long> *getter1;
  bool bVar1;
  ImPlotScale IVar2;
  ImU32 local_164;
  TransformerLogLog local_114;
  longlong *local_110;
  double local_108;
  undefined8 local_100;
  undefined8 local_f8;
  TransformerLinLog local_ec;
  longlong *local_e8;
  double local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  TransformerLogLin local_c4;
  longlong *local_c0;
  double local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  TransformerLinLin local_9c;
  longlong *local_98;
  double local_90;
  undefined8 local_88;
  undefined8 local_80;
  ImU32 local_78;
  ImU32 local_74;
  ImU32 col_fill;
  ImU32 col_line_1;
  ImPlotMarker marker;
  TransformerLogLin local_64;
  TransformerLinLin local_60;
  ImU32 local_5c;
  ImDrawList *pIStack_58;
  ImU32 col_line;
  ImDrawList *DrawList;
  ImPlotNextItemData *s;
  ImPlotPoint local_38;
  int local_24;
  GetterXsYRef<long_long> *pGStack_20;
  int i;
  GetterXsYRef<long_long> *get_base_local;
  GetterXsYs<long_long> *get_mark_local;
  char *label_id_local;
  
  pGStack_20 = get_base;
  get_base_local = (GetterXsYRef<long_long> *)get_mark;
  get_mark_local = (GetterXsYs<long_long> *)label_id;
  bVar1 = BeginItem(label_id,0);
  if (bVar1) {
    bVar1 = FitThisFrame();
    if (bVar1) {
      for (local_24 = 0; local_24 < pGStack_20->Count; local_24 = local_24 + 1) {
        local_38 = GetterXsYs<long_long>::operator()
                             ((GetterXsYs<long_long> *)get_base_local,local_24);
        FitPoint(&local_38);
        _s = GetterXsYRef<long_long>::operator()(pGStack_20,local_24);
        FitPoint((ImPlotPoint *)&s);
      }
    }
    DrawList = (ImDrawList *)GetItemData();
    pIStack_58 = GetPlotDrawList();
    if (((ulong)(DrawList->_TextureIdStack).Data & 0x100000000) != 0) {
      local_5c = ImGui::GetColorU32((ImVec4 *)DrawList);
      IVar2 = GetCurrentScale();
      getter1 = get_base_local;
      getter2 = pGStack_20;
      switch(IVar2) {
      case 0:
        TransformerLinLin::TransformerLinLin(&local_60);
        RenderLineSegments<ImPlot::GetterXsYs<long_long>,ImPlot::GetterXsYRef<long_long>,ImPlot::TransformerLinLin>
                  ((GetterXsYs<long_long> *)getter1,getter2,&local_60,pIStack_58,
                   *(float *)&DrawList->_IdxWritePtr,local_5c);
        break;
      case 1:
        TransformerLogLin::TransformerLogLin(&local_64);
        RenderLineSegments<ImPlot::GetterXsYs<long_long>,ImPlot::GetterXsYRef<long_long>,ImPlot::TransformerLogLin>
                  ((GetterXsYs<long_long> *)getter1,getter2,&local_64,pIStack_58,
                   *(float *)&DrawList->_IdxWritePtr,local_5c);
        break;
      case 2:
        TransformerLinLog::TransformerLinLog((TransformerLinLog *)&marker);
        RenderLineSegments<ImPlot::GetterXsYs<long_long>,ImPlot::GetterXsYRef<long_long>,ImPlot::TransformerLinLog>
                  ((GetterXsYs<long_long> *)getter1,getter2,(TransformerLinLog *)&marker,pIStack_58,
                   *(float *)&DrawList->_IdxWritePtr,local_5c);
        break;
      case 3:
        TransformerLogLog::TransformerLogLog((TransformerLogLog *)&col_line_1);
        RenderLineSegments<ImPlot::GetterXsYs<long_long>,ImPlot::GetterXsYRef<long_long>,ImPlot::TransformerLogLog>
                  ((GetterXsYs<long_long> *)getter1,getter2,(TransformerLogLog *)&col_line_1,
                   pIStack_58,*(float *)&DrawList->_IdxWritePtr,local_5c);
      }
    }
    if (*(int *)((long)&DrawList->_IdxWritePtr + 4) == -1) {
      local_164 = 0;
    }
    else {
      local_164 = *(ImU32 *)((long)&DrawList->_IdxWritePtr + 4);
    }
    col_fill = local_164;
    if (local_164 != 0xffffffff) {
      local_74 = ImGui::GetColorU32((ImVec4 *)&DrawList->VtxBuffer);
      local_78 = ImGui::GetColorU32((ImVec4 *)&DrawList->Flags);
      IVar2 = GetCurrentScale();
      switch(IVar2) {
      case 0:
        local_98 = get_base_local->Xs;
        local_90 = get_base_local->YRef;
        local_88._0_4_ = get_base_local->Count;
        local_88._4_4_ = get_base_local->Offset;
        local_80 = *(undefined8 *)&get_base_local->Stride;
        TransformerLinLin::TransformerLinLin(&local_9c);
        getter.Ys = (longlong *)local_90;
        getter.Xs = local_98;
        getter.Count = (undefined4)local_88;
        getter.Offset = local_88._4_4_;
        getter._24_8_ = local_80;
        RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterXsYs<long_long>>
                  (getter,local_9c,pIStack_58,col_fill,(float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_74,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_78);
        break;
      case 1:
        local_c0 = get_base_local->Xs;
        local_b8 = get_base_local->YRef;
        local_b0._0_4_ = get_base_local->Count;
        local_b0._4_4_ = get_base_local->Offset;
        local_a8 = *(undefined8 *)&get_base_local->Stride;
        TransformerLogLin::TransformerLogLin(&local_c4);
        getter_00.Ys = (longlong *)local_b8;
        getter_00.Xs = local_c0;
        getter_00.Count = (undefined4)local_b0;
        getter_00.Offset = local_b0._4_4_;
        getter_00._24_8_ = local_a8;
        RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterXsYs<long_long>>
                  (getter_00,local_c4,pIStack_58,col_fill,(float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_74,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_78);
        break;
      case 2:
        local_e8 = get_base_local->Xs;
        local_e0 = get_base_local->YRef;
        local_d8._0_4_ = get_base_local->Count;
        local_d8._4_4_ = get_base_local->Offset;
        local_d0 = *(undefined8 *)&get_base_local->Stride;
        TransformerLinLog::TransformerLinLog(&local_ec);
        getter_01.Ys = (longlong *)local_e0;
        getter_01.Xs = local_e8;
        getter_01.Count = (undefined4)local_d8;
        getter_01.Offset = local_d8._4_4_;
        getter_01._24_8_ = local_d0;
        RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterXsYs<long_long>>
                  (getter_01,local_ec,pIStack_58,col_fill,(float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_74,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_78);
        break;
      case 3:
        local_110 = get_base_local->Xs;
        local_108 = get_base_local->YRef;
        local_100._0_4_ = get_base_local->Count;
        local_100._4_4_ = get_base_local->Offset;
        local_f8 = *(undefined8 *)&get_base_local->Stride;
        TransformerLogLog::TransformerLogLog(&local_114);
        getter_02.Ys = (longlong *)local_108;
        getter_02.Xs = local_110;
        getter_02.Count = (undefined4)local_100;
        getter_02.Offset = local_100._4_4_;
        getter_02._24_8_ = local_f8;
        RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<long_long>>
                  (getter_02,local_114,pIStack_58,col_fill,(float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_74,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_78);
      }
    }
    EndItem();
  }
  return;
}

Assistant:

inline void PlotStemsEx(const char* label_id, const GetterM& get_mark, const GetterB& get_base) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < get_base.Count; ++i) {
                FitPoint(get_mark(i));
                FitPoint(get_base(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_mark, get_base, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_mark, get_base, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_mark, get_base, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_mark, get_base, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(get_mark, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(get_mark, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(get_mark, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(get_mark, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}